

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

ResourceManager * ResourceManager::getInstance(void)

{
  ResourceManager *pRVar1;
  
  if (rm == (ResourceManager *)0x0) {
    pRVar1 = (ResourceManager *)operator_new(0x18);
    ResourceManager((ResourceManager *)0x115867);
    rm = pRVar1;
  }
  return rm;
}

Assistant:

ResourceManager& ResourceManager::getInstance(void)
{
   if (!rm)
      rm = new ResourceManager();
   return *rm;
}